

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  long lVar1;
  int iVar2;
  Expr *pEVar3;
  char *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Expr *pWhere;
  Expr *pNew;
  sqlite3 *db;
  Select *pS;
  Expr t;
  ExprList *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  sqlite3 *in_stack_ffffffffffffff78;
  Expr *pRight;
  Parse *pParse;
  int local_54;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RSI == ',') {
    local_54 = 0;
  }
  else {
    lVar1 = in_RDI[5];
    iVar2 = sqlite3ExprIsConstantOrGroupBy
                      ((Parse *)in_stack_ffffffffffffff78,
                       (Expr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68);
    if (((iVar2 != 0) && ((*(uint *)(in_RSI + 4) & 0x20000001) != 0x20000000)) &&
       (*(long *)(in_RSI + 0x38) == 0)) {
      pParse = *(Parse **)*in_RDI;
      pEVar3 = sqlite3Expr(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                           (char *)in_stack_ffffffffffffff68);
      if (pEVar3 != (Expr *)0x0) {
        pRight = *(Expr **)(lVar1 + 0x30);
        memset(local_50,0xaa,0x48);
        memcpy(local_50,pEVar3,0x48);
        memcpy(pEVar3,in_RSI,0x48);
        memcpy(in_RSI,local_50,0x48);
        pEVar3 = sqlite3ExprAnd(pParse,pEVar3,pRight);
        *(Expr **)(lVar1 + 0x30) = pEVar3;
        *(undefined2 *)((long)in_RDI + 0x24) = 1;
      }
    }
    local_54 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    Select *pS = pWalker->u.pSelect;
    /* This routine is called before the HAVING clause of the current
    ** SELECT is analyzed for aggregates. So if pExpr->pAggInfo is set
    ** here, it indicates that the expression is a correlated reference to a
    ** column from an outer aggregate query, or an aggregate function that
    ** belongs to an outer query. Do not move the expression to the WHERE
    ** clause in this obscure case, as doing so may corrupt the outer Select
    ** statements AggInfo structure.  */
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, pS->pGroupBy)
     && ExprAlwaysFalse(pExpr)==0
     && pExpr->pAggInfo==0
    ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3Expr(db, TK_INTEGER, "1");
      if( pNew ){
        Expr *pWhere = pS->pWhere;
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(pWalker->pParse, pWhere, pNew);
        pS->pWhere = pNew;
        pWalker->eCode = 1;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}